

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramInfoLogCase::test(ProgramInfoLogCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  char *pcVar3;
  TestContext *pTVar4;
  bool bVar5;
  GLint written;
  allocator<char> local_9e1;
  ScopedLogSection section;
  StateQueryMemoryWriteGuard<int> logLength;
  char *frgSource;
  char *vtxSource;
  undefined1 local_9b8 [384];
  char buffer [2048];
  
  bVar5 = this->m_buildErrorType == BUILDERROR_COMPILE;
  vtxSource = 
  "#version 300 es\nin highp vec4 a_pos;\nuniform highp vec4 u_uniform;\nvoid main ()\n{\n\tgl_Position = a_pos + u_uniform;\n}\n"
  ;
  if (bVar5) {
    vtxSource = Functional::(anonymous_namespace)::brokenShader;
  }
  frgSource = 
  "#version 300 es\nin highp vec4 v_missingVar;\nuniform highp int u_uniform;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main ()\n{\n\tfragColor = v_missingVar + vec4(float(u_uniform));\n}\n"
  ;
  if (bVar5) {
    frgSource = Functional::(anonymous_namespace)::brokenShader;
  }
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&vtxSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,&frgSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&logLength)
  ;
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,&logLength.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            (&logLength,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
            );
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,"QueryLarge",(allocator<char> *)&written);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_9b8,"Query to large buffer",&local_9e1);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)buffer,(string *)local_9b8);
  std::__cxx11::string::~string((string *)local_9b8);
  std::__cxx11::string::~string((string *)buffer);
  memset(buffer,0,0x800);
  buffer[0] = 'x';
  written = 0;
  glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x800,&written,buffer);
  if (logLength.m_value != 0) {
    if (written + 1 == logLength.m_value) {
      if (buffer[written] != '\0') {
        local_9b8._0_8_ =
             ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_9b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"// ERROR: Expected null terminator at index ");
        std::ostream::operator<<(poVar1,written);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        pTVar4 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
        if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
          pcVar3 = "missing null terminator";
          goto LAB_010d2dd1;
        }
      }
    }
    else {
      local_9b8._0_8_ =
           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_9b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// ERROR: Expected INFO_LOG_LENGTH ");
      std::ostream::operator<<(poVar1,written + 1);
      std::operator<<((ostream *)poVar1,"; got ");
      std::ostream::operator<<(poVar1,logLength.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar4 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
        pcVar3 = "got invalid log length";
LAB_010d2dd1:
        tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,pcVar3);
      }
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if (0x7ff < logLength.m_value) goto LAB_010d2f9f;
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,"QueryAll",(allocator<char> *)&written);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_9b8,"Query all to exactly right sized buffer",&local_9e1);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)buffer,(string *)local_9b8);
  std::__cxx11::string::~string((string *)local_9b8);
  std::__cxx11::string::~string((string *)buffer);
  memset(buffer,0,0x800);
  buffer[0] = 'x';
  written = 0;
  glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,logLength.m_value,&written,buffer);
  if (logLength.m_value != 0) {
    if (written + 1 == logLength.m_value) {
      if (buffer[written] != '\0') {
        local_9b8._0_8_ =
             ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_9b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"// ERROR: Expected null terminator at index ");
        std::ostream::operator<<(poVar1,written);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        pTVar4 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
        if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
          pcVar3 = "missing null terminator";
          goto LAB_010d2f8d;
        }
      }
    }
    else {
      local_9b8._0_8_ =
           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_9b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"// ERROR: Expected INFO_LOG_LENGTH ");
      std::ostream::operator<<(poVar1,written + 1);
      std::operator<<((ostream *)poVar1,"; got ");
      std::ostream::operator<<(poVar1,logLength.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pTVar4 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
        pcVar3 = "got invalid log length";
LAB_010d2f8d:
        tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,pcVar3);
      }
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
LAB_010d2f9f:
  pTVar2 = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,"QueryNone",(allocator<char> *)&written);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_9b8,"Query none",&local_9e1);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)buffer,(string *)local_9b8);
  std::__cxx11::string::~string((string *)local_9b8);
  std::__cxx11::string::~string((string *)buffer);
  memset(buffer,0,0x800);
  buffer[0] = 'x';
  written = 0;
  glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,1,&written,buffer);
  if (written != 0) {
    local_9b8._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_9b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// ERROR: Expected write length 0; got ");
    std::ostream::operator<<(poVar1,written);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pTVar4 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar4->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,"got invalid log length");
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader_00);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		enum
		{
			BUF_SIZE = 2048
		};

		static const char* const linkErrorVtxSource = "#version 300 es\n"
													  "in highp vec4 a_pos;\n"
													  "uniform highp vec4 u_uniform;\n"
													  "void main ()\n"
													  "{\n"
													  "	gl_Position = a_pos + u_uniform;\n"
													  "}\n";
		static const char* const linkErrorFrgSource = "#version 300 es\n"
													  "in highp vec4 v_missingVar;\n"
													  "uniform highp int u_uniform;\n"
													  "layout(location = 0) out mediump vec4 fragColor;\n"
													  "void main ()\n"
													  "{\n"
													  "	fragColor = v_missingVar + vec4(float(u_uniform));\n"
													  "}\n";

		const char* vtxSource = (m_buildErrorType == BUILDERROR_COMPILE) ? (brokenShader) : (linkErrorVtxSource);
		const char* frgSource = (m_buildErrorType == BUILDERROR_COMPILE) ? (brokenShader) : (linkErrorFrgSource);

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &vtxSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &frgSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);

		StateQueryMemoryWriteGuard<GLint> logLength;
		glGetProgramiv(program, GL_INFO_LOG_LENGTH, &logLength);
		logLength.verifyValidity(m_testCtx);

		// check INFO_LOG_LENGTH == GetProgramInfoLog len
		{
			const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "QueryLarge", "Query to large buffer");
			char						buffer[BUF_SIZE]	= {'x'};
			GLint						written				= 0;

			glGetProgramInfoLog(program, BUF_SIZE, &written, buffer);

			if (logLength != 0 && written+1 != logLength) // INFO_LOG_LENGTH contains 0-terminator
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected INFO_LOG_LENGTH " << written+1 << "; got " << logLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
			else if (logLength != 0 && buffer[written] != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator at index " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing null terminator");
			}
		}

		// check query to just correct sized buffer
		if (BUF_SIZE > logLength)
		{
			const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "QueryAll", "Query all to exactly right sized buffer");
			char						buffer[BUF_SIZE]	= {'x'};
			GLint						written				= 0;

			glGetProgramInfoLog(program, logLength, &written, buffer);

			if (logLength != 0 && written+1 != logLength) // INFO_LOG_LENGTH contains 0-terminator
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected INFO_LOG_LENGTH " << written+1 << "; got " << logLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
			else if (logLength != 0 && buffer[written] != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator at index " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing null terminator");
			}
		}

		// check GetProgramInfoLog works with too small buffer
		{
			const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "QueryNone", "Query none");
			char						buffer[BUF_SIZE]	= {'x'};
			GLint						written				= 0;

			glGetProgramInfoLog(program, 1, &written, buffer);

			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected write length 0; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}